

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_modifiers_unittest.cc
# Opt level: O0

void Test_TemplateModifiers_SnippetEscape::Run(void)

{
  TemplateString TVar1;
  TemplateString TVar2;
  TemplateString TVar3;
  TemplateString TVar4;
  TemplateString TVar5;
  TemplateString TVar6;
  TemplateString TVar7;
  TemplateString TVar8;
  TemplateString TVar9;
  TemplateString TVar10;
  TemplateString TVar11;
  TemplateString TVar12;
  TemplateString TVar13;
  TemplateString TVar14;
  TemplateString TVar15;
  TemplateString TVar16;
  TemplateString TVar17;
  TemplateString TVar18;
  TemplateString TVar19;
  TemplateString TVar20;
  TemplateString TVar21;
  TemplateString TVar22;
  TemplateString TVar23;
  TemplateString TVar24;
  TemplateString TVar25;
  TemplateString TVar26;
  TemplateString TVar27;
  TemplateString TVar28;
  TemplateString TVar29;
  TemplateString TVar30;
  TemplateString TVar31;
  TemplateString TVar32;
  TemplateString TVar33;
  TemplateString TVar34;
  TemplateString TVar35;
  TemplateString TVar36;
  TemplateString TVar37;
  TemplateString TVar38;
  TemplateString TVar39;
  TemplateString TVar40;
  TemplateString TVar41;
  TemplateString TVar42;
  TemplateString TVar43;
  TemplateString TVar44;
  TemplateString TVar45;
  TemplateString TVar46;
  TemplateString TVar47;
  TemplateString TVar48;
  TemplateString TVar49;
  TemplateString TVar50;
  TemplateString TVar51;
  TemplateString TVar52;
  TemplateString TVar53;
  TemplateString TVar54;
  TemplateString TVar55;
  TemplateString TVar56;
  TemplateString TVar57;
  TemplateString TVar58;
  TemplateString TVar59;
  TemplateString TVar60;
  int iVar61;
  char *pcVar62;
  TemplateString local_bf0;
  TemplateString local_bd0;
  TemplateString local_bb0;
  TemplateString local_b90;
  TemplateString local_b70;
  TemplateString local_b50;
  TemplateString local_b30;
  TemplateString local_b10;
  TemplateString local_af0;
  TemplateString local_ad0;
  TemplateString local_ab0;
  TemplateString local_a90;
  TemplateString local_a70;
  TemplateString local_a50;
  TemplateString local_a30;
  TemplateString local_a10;
  TemplateString local_9f0;
  TemplateString local_9d0;
  TemplateString local_9b0;
  TemplateString local_990;
  TemplateString local_970;
  TemplateString local_950;
  TemplateString local_930;
  TemplateString local_910;
  TemplateString local_8f0;
  TemplateString local_8d0;
  TemplateString local_8b0;
  TemplateString local_890;
  TemplateString local_870;
  TemplateString local_850;
  TemplateDictionaryPeer local_830;
  TemplateDictionaryPeer peer;
  size_t sStack_820;
  undefined8 local_818;
  TemplateId TStack_810;
  TemplateString local_808;
  TemplateString local_7e8;
  TemplateString local_7c8;
  TemplateString local_7a8;
  TemplateString local_788;
  TemplateString local_768;
  TemplateString local_748;
  TemplateString local_728;
  TemplateString local_708;
  TemplateString local_6e8;
  TemplateString local_6c8;
  TemplateString local_6a8;
  TemplateString local_688;
  TemplateString local_668;
  TemplateString local_648;
  TemplateString local_628;
  TemplateString local_608;
  TemplateString local_5e8;
  TemplateString local_5c8;
  TemplateString local_5a8;
  TemplateString local_588;
  TemplateString local_568;
  TemplateString local_548;
  TemplateString local_528;
  TemplateString local_508;
  TemplateString local_4e8;
  TemplateString local_4c8;
  TemplateString local_4a8;
  TemplateString local_488;
  TemplateString local_468;
  TemplateString local_448;
  TemplateString local_428;
  TemplateString local_408;
  TemplateString local_3e8;
  TemplateString local_3c8;
  TemplateString local_3a8;
  TemplateString local_388;
  TemplateString local_368;
  TemplateString local_348;
  TemplateString local_328;
  TemplateString local_308;
  TemplateString local_2e8;
  TemplateString local_2c8;
  TemplateString local_2a8;
  TemplateString local_288;
  TemplateString local_268;
  TemplateString local_248;
  TemplateString local_228;
  TemplateString local_208;
  TemplateString local_1e8;
  TemplateString local_1c8;
  TemplateString local_1a8;
  TemplateString local_188;
  TemplateString local_168;
  TemplateString local_148;
  TemplateString local_128;
  TemplateString local_108;
  TemplateString local_e8;
  TemplateString local_b8;
  TemplateString local_98;
  TemplateDictionary local_78 [8];
  TemplateDictionary dict;
  
  ctemplate::TemplateString::TemplateString(&local_98,"TestSnippetEscape");
  ctemplate::TemplateDictionary::TemplateDictionary(local_78,&local_98,(UnsafeArena *)0x0);
  ctemplate::TemplateString::TemplateString(&local_b8,"easy snippet");
  ctemplate::TemplateString::TemplateString(&local_e8,"foo");
  TVar1.length_ = local_b8.length_;
  TVar1.ptr_ = local_b8.ptr_;
  TVar1.is_immutable_ = local_b8.is_immutable_;
  TVar1._17_7_ = local_b8._17_7_;
  TVar1.id_ = local_b8.id_;
  TVar31.length_ = local_e8.length_;
  TVar31.ptr_ = local_e8.ptr_;
  TVar31.is_immutable_ = local_e8.is_immutable_;
  TVar31._17_7_ = local_e8._17_7_;
  TVar31.id_ = local_e8.id_;
  ctemplate::TemplateDictionary::SetEscapedValue(TVar1,TVar31,(TemplateModifier *)local_78);
  ctemplate::TemplateString::TemplateString(&local_108,"valid snippet");
  ctemplate::TemplateString::TemplateString(&local_128,"<b>foo<br> &amp; b<wbr>&shy;ar</b>");
  TVar2.length_ = local_108.length_;
  TVar2.ptr_ = local_108.ptr_;
  TVar2.is_immutable_ = local_108.is_immutable_;
  TVar2._17_7_ = local_108._17_7_;
  TVar2.id_ = local_108.id_;
  TVar32.length_ = local_128.length_;
  TVar32.ptr_ = local_128.ptr_;
  TVar32.is_immutable_ = local_128.is_immutable_;
  TVar32._17_7_ = local_128._17_7_;
  TVar32.id_ = local_128.id_;
  ctemplate::TemplateDictionary::SetEscapedValue(TVar2,TVar32,(TemplateModifier *)local_78);
  ctemplate::TemplateString::TemplateString(&local_148,"invalid snippet");
  ctemplate::TemplateString::TemplateString
            (&local_168,"<b><A HREF=\'foo\'\nid=\"bar\t\t&&{\vbaz\">");
  TVar3.length_ = local_148.length_;
  TVar3.ptr_ = local_148.ptr_;
  TVar3.is_immutable_ = local_148.is_immutable_;
  TVar3._17_7_ = local_148._17_7_;
  TVar3.id_ = local_148.id_;
  TVar33.length_ = local_168.length_;
  TVar33.ptr_ = local_168.ptr_;
  TVar33.is_immutable_ = local_168.is_immutable_;
  TVar33._17_7_ = local_168._17_7_;
  TVar33.id_ = local_168.id_;
  ctemplate::TemplateDictionary::SetEscapedValue(TVar3,TVar33,(TemplateModifier *)local_78);
  ctemplate::TemplateString::TemplateString(&local_188,"snippet with italics");
  ctemplate::TemplateString::TemplateString(&local_1a8,"<i>foo<br> &amp; b<wbr>&shy;ar</i>");
  TVar4.length_ = local_188.length_;
  TVar4.ptr_ = local_188.ptr_;
  TVar4.is_immutable_ = local_188.is_immutable_;
  TVar4._17_7_ = local_188._17_7_;
  TVar4.id_ = local_188.id_;
  TVar34.length_ = local_1a8.length_;
  TVar34.ptr_ = local_1a8.ptr_;
  TVar34.is_immutable_ = local_1a8.is_immutable_;
  TVar34._17_7_ = local_1a8._17_7_;
  TVar34.id_ = local_1a8.id_;
  ctemplate::TemplateDictionary::SetEscapedValue(TVar4,TVar34,(TemplateModifier *)local_78);
  ctemplate::TemplateString::TemplateString(&local_1c8,"unclosed snippet");
  ctemplate::TemplateString::TemplateString(&local_1e8,"<b>foo");
  TVar5.length_ = local_1c8.length_;
  TVar5.ptr_ = local_1c8.ptr_;
  TVar5.is_immutable_ = local_1c8.is_immutable_;
  TVar5._17_7_ = local_1c8._17_7_;
  TVar5.id_ = local_1c8.id_;
  TVar35.length_ = local_1e8.length_;
  TVar35.ptr_ = local_1e8.ptr_;
  TVar35.is_immutable_ = local_1e8.is_immutable_;
  TVar35._17_7_ = local_1e8._17_7_;
  TVar35.id_ = local_1e8.id_;
  ctemplate::TemplateDictionary::SetEscapedValue(TVar5,TVar35,(TemplateModifier *)local_78);
  ctemplate::TemplateString::TemplateString(&local_208,"snippet with interleaving");
  ctemplate::TemplateString::TemplateString(&local_228,"<b><i>foo</b></i>");
  TVar6.length_ = local_208.length_;
  TVar6.ptr_ = local_208.ptr_;
  TVar6.is_immutable_ = local_208.is_immutable_;
  TVar6._17_7_ = local_208._17_7_;
  TVar6.id_ = local_208.id_;
  TVar36.length_ = local_228.length_;
  TVar36.ptr_ = local_228.ptr_;
  TVar36.is_immutable_ = local_228.is_immutable_;
  TVar36._17_7_ = local_228._17_7_;
  TVar36.id_ = local_228.id_;
  ctemplate::TemplateDictionary::SetEscapedValue(TVar6,TVar36,(TemplateModifier *)local_78);
  ctemplate::TemplateString::TemplateString(&local_248,"unclosed interleaving");
  ctemplate::TemplateString::TemplateString(&local_268,"<b><i><b>foo</b>");
  TVar7.length_ = local_248.length_;
  TVar7.ptr_ = local_248.ptr_;
  TVar7.is_immutable_ = local_248.is_immutable_;
  TVar7._17_7_ = local_248._17_7_;
  TVar7.id_ = local_248.id_;
  TVar37.length_ = local_268.length_;
  TVar37.ptr_ = local_268.ptr_;
  TVar37.is_immutable_ = local_268.is_immutable_;
  TVar37._17_7_ = local_268._17_7_;
  TVar37.id_ = local_268.id_;
  ctemplate::TemplateDictionary::SetEscapedValue(TVar7,TVar37,(TemplateModifier *)local_78);
  ctemplate::TemplateString::TemplateString(&local_288,"unclosed");
  ctemplate::TemplateString::TemplateString(&local_2a8,"<b><i>foo");
  TVar8.length_ = local_288.length_;
  TVar8.ptr_ = local_288.ptr_;
  TVar8.is_immutable_ = local_288.is_immutable_;
  TVar8._17_7_ = local_288._17_7_;
  TVar8.id_ = local_288.id_;
  TVar38.length_ = local_2a8.length_;
  TVar38.ptr_ = local_2a8.ptr_;
  TVar38.is_immutable_ = local_2a8.is_immutable_;
  TVar38._17_7_ = local_2a8._17_7_;
  TVar38.id_ = local_2a8.id_;
  ctemplate::TemplateDictionary::SetEscapedValue(TVar8,TVar38,(TemplateModifier *)local_78);
  ctemplate::TemplateString::TemplateString(&local_2c8,"unterminated 1");
  ctemplate::TemplateString::TemplateString(&local_2e8,"foo<");
  TVar9.length_ = local_2c8.length_;
  TVar9.ptr_ = local_2c8.ptr_;
  TVar9.is_immutable_ = local_2c8.is_immutable_;
  TVar9._17_7_ = local_2c8._17_7_;
  TVar9.id_ = local_2c8.id_;
  TVar39.length_ = local_2e8.length_;
  TVar39.ptr_ = local_2e8.ptr_;
  TVar39.is_immutable_ = local_2e8.is_immutable_;
  TVar39._17_7_ = local_2e8._17_7_;
  TVar39.id_ = local_2e8.id_;
  ctemplate::TemplateDictionary::SetEscapedValue(TVar9,TVar39,(TemplateModifier *)local_78);
  ctemplate::TemplateString::TemplateString(&local_308,"unterminated 2");
  ctemplate::TemplateString::TemplateString(&local_328,"foo<b");
  TVar10.length_ = local_308.length_;
  TVar10.ptr_ = local_308.ptr_;
  TVar10.is_immutable_ = local_308.is_immutable_;
  TVar10._17_7_ = local_308._17_7_;
  TVar10.id_ = local_308.id_;
  TVar40.length_ = local_328.length_;
  TVar40.ptr_ = local_328.ptr_;
  TVar40.is_immutable_ = local_328.is_immutable_;
  TVar40._17_7_ = local_328._17_7_;
  TVar40.id_ = local_328.id_;
  ctemplate::TemplateDictionary::SetEscapedValue(TVar10,TVar40,(TemplateModifier *)local_78);
  ctemplate::TemplateString::TemplateString(&local_348,"unterminated 3");
  ctemplate::TemplateString::TemplateString(&local_368,"foo</");
  TVar11.length_ = local_348.length_;
  TVar11.ptr_ = local_348.ptr_;
  TVar11.is_immutable_ = local_348.is_immutable_;
  TVar11._17_7_ = local_348._17_7_;
  TVar11.id_ = local_348.id_;
  TVar41.length_ = local_368.length_;
  TVar41.ptr_ = local_368.ptr_;
  TVar41.is_immutable_ = local_368.is_immutable_;
  TVar41._17_7_ = local_368._17_7_;
  TVar41.id_ = local_368.id_;
  ctemplate::TemplateDictionary::SetEscapedValue(TVar11,TVar41,(TemplateModifier *)local_78);
  ctemplate::TemplateString::TemplateString(&local_388,"unterminated 4");
  ctemplate::TemplateString::TemplateString(&local_3a8,"foo</b");
  TVar12.length_ = local_388.length_;
  TVar12.ptr_ = local_388.ptr_;
  TVar12.is_immutable_ = local_388.is_immutable_;
  TVar12._17_7_ = local_388._17_7_;
  TVar12.id_ = local_388.id_;
  TVar42.length_ = local_3a8.length_;
  TVar42.ptr_ = local_3a8.ptr_;
  TVar42.is_immutable_ = local_3a8.is_immutable_;
  TVar42._17_7_ = local_3a8._17_7_;
  TVar42.id_ = local_3a8.id_;
  ctemplate::TemplateDictionary::SetEscapedValue(TVar12,TVar42,(TemplateModifier *)local_78);
  ctemplate::TemplateString::TemplateString(&local_3c8,"unterminated 5");
  ctemplate::TemplateString::TemplateString(&local_3e8,"<b>foo</b");
  TVar13.length_ = local_3c8.length_;
  TVar13.ptr_ = local_3c8.ptr_;
  TVar13.is_immutable_ = local_3c8.is_immutable_;
  TVar13._17_7_ = local_3c8._17_7_;
  TVar13.id_ = local_3c8.id_;
  TVar43.length_ = local_3e8.length_;
  TVar43.ptr_ = local_3e8.ptr_;
  TVar43.is_immutable_ = local_3e8.is_immutable_;
  TVar43._17_7_ = local_3e8._17_7_;
  TVar43.id_ = local_3e8.id_;
  ctemplate::TemplateDictionary::SetEscapedValue(TVar13,TVar43,(TemplateModifier *)local_78);
  ctemplate::TemplateString::TemplateString(&local_408,"close b i");
  ctemplate::TemplateString::TemplateString(&local_428,"<i><b>foo");
  TVar14.length_ = local_408.length_;
  TVar14.ptr_ = local_408.ptr_;
  TVar14.is_immutable_ = local_408.is_immutable_;
  TVar14._17_7_ = local_408._17_7_;
  TVar14.id_ = local_408.id_;
  TVar44.length_ = local_428.length_;
  TVar44.ptr_ = local_428.ptr_;
  TVar44.is_immutable_ = local_428.is_immutable_;
  TVar44._17_7_ = local_428._17_7_;
  TVar44.id_ = local_428.id_;
  ctemplate::TemplateDictionary::SetEscapedValue(TVar14,TVar44,(TemplateModifier *)local_78);
  ctemplate::TemplateString::TemplateString(&local_448,"close i b");
  ctemplate::TemplateString::TemplateString(&local_468,"<b><i>foo");
  TVar15.length_ = local_448.length_;
  TVar15.ptr_ = local_448.ptr_;
  TVar15.is_immutable_ = local_448.is_immutable_;
  TVar15._17_7_ = local_448._17_7_;
  TVar15.id_ = local_448.id_;
  TVar45.length_ = local_468.length_;
  TVar45.ptr_ = local_468.ptr_;
  TVar45.is_immutable_ = local_468.is_immutable_;
  TVar45._17_7_ = local_468._17_7_;
  TVar45.id_ = local_468.id_;
  ctemplate::TemplateDictionary::SetEscapedValue(TVar15,TVar45,(TemplateModifier *)local_78);
  ctemplate::TemplateString::TemplateString(&local_488,"em");
  ctemplate::TemplateString::TemplateString(&local_4a8,"<em>foo</em>");
  TVar16.length_ = local_488.length_;
  TVar16.ptr_ = local_488.ptr_;
  TVar16.is_immutable_ = local_488.is_immutable_;
  TVar16._17_7_ = local_488._17_7_;
  TVar16.id_ = local_488.id_;
  TVar46.length_ = local_4a8.length_;
  TVar46.ptr_ = local_4a8.ptr_;
  TVar46.is_immutable_ = local_4a8.is_immutable_;
  TVar46._17_7_ = local_4a8._17_7_;
  TVar46.id_ = local_4a8.id_;
  ctemplate::TemplateDictionary::SetEscapedValue(TVar16,TVar46,(TemplateModifier *)local_78);
  ctemplate::TemplateString::TemplateString(&local_4c8,"nested em");
  ctemplate::TemplateString::TemplateString(&local_4e8,"<b>This is foo<em>...</em></b>");
  TVar17.length_ = local_4c8.length_;
  TVar17.ptr_ = local_4c8.ptr_;
  TVar17.is_immutable_ = local_4c8.is_immutable_;
  TVar17._17_7_ = local_4c8._17_7_;
  TVar17.id_ = local_4c8.id_;
  TVar47.length_ = local_4e8.length_;
  TVar47.ptr_ = local_4e8.ptr_;
  TVar47.is_immutable_ = local_4e8.is_immutable_;
  TVar47._17_7_ = local_4e8._17_7_;
  TVar47.id_ = local_4e8.id_;
  ctemplate::TemplateDictionary::SetEscapedValue(TVar17,TVar47,(TemplateModifier *)local_78);
  ctemplate::TemplateString::TemplateString(&local_508,"unclosed em");
  ctemplate::TemplateString::TemplateString(&local_528,"<em>foo");
  TVar18.length_ = local_508.length_;
  TVar18.ptr_ = local_508.ptr_;
  TVar18.is_immutable_ = local_508.is_immutable_;
  TVar18._17_7_ = local_508._17_7_;
  TVar18.id_ = local_508.id_;
  TVar48.length_ = local_528.length_;
  TVar48.ptr_ = local_528.ptr_;
  TVar48.is_immutable_ = local_528.is_immutable_;
  TVar48._17_7_ = local_528._17_7_;
  TVar48.id_ = local_528.id_;
  ctemplate::TemplateDictionary::SetEscapedValue(TVar18,TVar48,(TemplateModifier *)local_78);
  ctemplate::TemplateString::TemplateString(&local_548,"wrongly closed em");
  ctemplate::TemplateString::TemplateString(&local_568,"foo</em>");
  TVar19.length_ = local_548.length_;
  TVar19.ptr_ = local_548.ptr_;
  TVar19.is_immutable_ = local_548.is_immutable_;
  TVar19._17_7_ = local_548._17_7_;
  TVar19.id_ = local_548.id_;
  TVar49.length_ = local_568.length_;
  TVar49.ptr_ = local_568.ptr_;
  TVar49.is_immutable_ = local_568.is_immutable_;
  TVar49._17_7_ = local_568._17_7_;
  TVar49.id_ = local_568.id_;
  ctemplate::TemplateDictionary::SetEscapedValue(TVar19,TVar49,(TemplateModifier *)local_78);
  ctemplate::TemplateString::TemplateString(&local_588,"misnested em");
  ctemplate::TemplateString::TemplateString(&local_5a8,"<i><em>foo</i></em>");
  TVar20.length_ = local_588.length_;
  TVar20.ptr_ = local_588.ptr_;
  TVar20.is_immutable_ = local_588.is_immutable_;
  TVar20._17_7_ = local_588._17_7_;
  TVar20.id_ = local_588.id_;
  TVar50.length_ = local_5a8.length_;
  TVar50.ptr_ = local_5a8.ptr_;
  TVar50.is_immutable_ = local_5a8.is_immutable_;
  TVar50._17_7_ = local_5a8._17_7_;
  TVar50.id_ = local_5a8.id_;
  ctemplate::TemplateDictionary::SetEscapedValue(TVar20,TVar50,(TemplateModifier *)local_78);
  ctemplate::TemplateString::TemplateString(&local_5c8,"span ltr");
  ctemplate::TemplateString::TemplateString(&local_5e8,"<span dir=ltr>bidi text</span>");
  TVar21.length_ = local_5c8.length_;
  TVar21.ptr_ = local_5c8.ptr_;
  TVar21.is_immutable_ = local_5c8.is_immutable_;
  TVar21._17_7_ = local_5c8._17_7_;
  TVar21.id_ = local_5c8.id_;
  TVar51.length_ = local_5e8.length_;
  TVar51.ptr_ = local_5e8.ptr_;
  TVar51.is_immutable_ = local_5e8.is_immutable_;
  TVar51._17_7_ = local_5e8._17_7_;
  TVar51.id_ = local_5e8.id_;
  ctemplate::TemplateDictionary::SetEscapedValue(TVar21,TVar51,(TemplateModifier *)local_78);
  ctemplate::TemplateString::TemplateString(&local_608,"span rtl");
  ctemplate::TemplateString::TemplateString(&local_628,"<span dir=rtl>bidi text</span>");
  TVar22.length_ = local_608.length_;
  TVar22.ptr_ = local_608.ptr_;
  TVar22.is_immutable_ = local_608.is_immutable_;
  TVar22._17_7_ = local_608._17_7_;
  TVar22.id_ = local_608.id_;
  TVar52.length_ = local_628.length_;
  TVar52.ptr_ = local_628.ptr_;
  TVar52.is_immutable_ = local_628.is_immutable_;
  TVar52._17_7_ = local_628._17_7_;
  TVar52.id_ = local_628.id_;
  ctemplate::TemplateDictionary::SetEscapedValue(TVar22,TVar52,(TemplateModifier *)local_78);
  ctemplate::TemplateString::TemplateString(&local_648,"span garbage dir attr");
  ctemplate::TemplateString::TemplateString(&local_668,"<span dir=foo>bidi text</span>");
  TVar23.length_ = local_648.length_;
  TVar23.ptr_ = local_648.ptr_;
  TVar23.is_immutable_ = local_648.is_immutable_;
  TVar23._17_7_ = local_648._17_7_;
  TVar23.id_ = local_648.id_;
  TVar53.length_ = local_668.length_;
  TVar53.ptr_ = local_668.ptr_;
  TVar53.is_immutable_ = local_668.is_immutable_;
  TVar53._17_7_ = local_668._17_7_;
  TVar53.id_ = local_668.id_;
  ctemplate::TemplateDictionary::SetEscapedValue(TVar23,TVar53,(TemplateModifier *)local_78);
  ctemplate::TemplateString::TemplateString(&local_688,"span no dir");
  ctemplate::TemplateString::TemplateString(&local_6a8,"<span>bidi text</span>");
  TVar24.length_ = local_688.length_;
  TVar24.ptr_ = local_688.ptr_;
  TVar24.is_immutable_ = local_688.is_immutable_;
  TVar24._17_7_ = local_688._17_7_;
  TVar24.id_ = local_688.id_;
  TVar54.length_ = local_6a8.length_;
  TVar54.ptr_ = local_6a8.ptr_;
  TVar54.is_immutable_ = local_6a8.is_immutable_;
  TVar54._17_7_ = local_6a8._17_7_;
  TVar54.id_ = local_6a8.id_;
  ctemplate::TemplateDictionary::SetEscapedValue(TVar24,TVar54,(TemplateModifier *)local_78);
  ctemplate::TemplateString::TemplateString(&local_6c8,"span bad attribute");
  ctemplate::TemplateString::TemplateString
            (&local_6e8,"<span onclick=alert(\'foo\')>bidi text</span>");
  TVar25.length_ = local_6c8.length_;
  TVar25.ptr_ = local_6c8.ptr_;
  TVar25.is_immutable_ = local_6c8.is_immutable_;
  TVar25._17_7_ = local_6c8._17_7_;
  TVar25.id_ = local_6c8.id_;
  TVar55.length_ = local_6e8.length_;
  TVar55.ptr_ = local_6e8.ptr_;
  TVar55.is_immutable_ = local_6e8.is_immutable_;
  TVar55._17_7_ = local_6e8._17_7_;
  TVar55.id_ = local_6e8.id_;
  ctemplate::TemplateDictionary::SetEscapedValue(TVar25,TVar55,(TemplateModifier *)local_78);
  ctemplate::TemplateString::TemplateString(&local_708,"span quotes");
  ctemplate::TemplateString::TemplateString(&local_728,"<span dir=\"rtl\">bidi text</span>");
  TVar26.length_ = local_708.length_;
  TVar26.ptr_ = local_708.ptr_;
  TVar26.is_immutable_ = local_708.is_immutable_;
  TVar26._17_7_ = local_708._17_7_;
  TVar26.id_ = local_708.id_;
  TVar56.length_ = local_728.length_;
  TVar56.ptr_ = local_728.ptr_;
  TVar56.is_immutable_ = local_728.is_immutable_;
  TVar56._17_7_ = local_728._17_7_;
  TVar56.id_ = local_728.id_;
  ctemplate::TemplateDictionary::SetEscapedValue(TVar26,TVar56,(TemplateModifier *)local_78);
  ctemplate::TemplateString::TemplateString(&local_748,"nested span");
  ctemplate::TemplateString::TemplateString
            (&local_768,"<b>This is <span dir=rtl>bidi text</span></b>");
  TVar27.length_ = local_748.length_;
  TVar27.ptr_ = local_748.ptr_;
  TVar27.is_immutable_ = local_748.is_immutable_;
  TVar27._17_7_ = local_748._17_7_;
  TVar27.id_ = local_748.id_;
  TVar57.length_ = local_768.length_;
  TVar57.ptr_ = local_768.ptr_;
  TVar57.is_immutable_ = local_768.is_immutable_;
  TVar57._17_7_ = local_768._17_7_;
  TVar57.id_ = local_768.id_;
  ctemplate::TemplateDictionary::SetEscapedValue(TVar27,TVar57,(TemplateModifier *)local_78);
  ctemplate::TemplateString::TemplateString(&local_788,"doubly-nested span");
  ctemplate::TemplateString::TemplateString
            (&local_7a8,"<span dir=rtl>This is <span dir=rtl>bidi text</span></span>");
  TVar28.length_ = local_788.length_;
  TVar28.ptr_ = local_788.ptr_;
  TVar28.is_immutable_ = local_788.is_immutable_;
  TVar28._17_7_ = local_788._17_7_;
  TVar28.id_ = local_788.id_;
  TVar58.length_ = local_7a8.length_;
  TVar58.ptr_ = local_7a8.ptr_;
  TVar58.is_immutable_ = local_7a8.is_immutable_;
  TVar58._17_7_ = local_7a8._17_7_;
  TVar58.id_ = local_7a8.id_;
  ctemplate::TemplateDictionary::SetEscapedValue(TVar28,TVar58,(TemplateModifier *)local_78);
  ctemplate::TemplateString::TemplateString(&local_7c8,"two spans");
  ctemplate::TemplateString::TemplateString
            (&local_7e8,
             "<b>This is <span dir=rtl>text</span> that is <span dir=rtl>bidi.</span></b>");
  TVar29.length_ = local_7c8.length_;
  TVar29.ptr_ = local_7c8.ptr_;
  TVar29.is_immutable_ = local_7c8.is_immutable_;
  TVar29._17_7_ = local_7c8._17_7_;
  TVar29.id_ = local_7c8.id_;
  TVar59.length_ = local_7e8.length_;
  TVar59.ptr_ = local_7e8.ptr_;
  TVar59.is_immutable_ = local_7e8.is_immutable_;
  TVar59._17_7_ = local_7e8._17_7_;
  TVar59.id_ = local_7e8.id_;
  ctemplate::TemplateDictionary::SetEscapedValue(TVar29,TVar59,(TemplateModifier *)local_78);
  ctemplate::TemplateString::TemplateString(&local_808,"unclosed span");
  ctemplate::TemplateString::TemplateString
            ((TemplateString *)&peer,"<b>This is <span dir=rtl>bidi text");
  TVar30.length_ = local_808.length_;
  TVar30.ptr_ = local_808.ptr_;
  TVar30.is_immutable_ = local_808.is_immutable_;
  TVar30._17_7_ = local_808._17_7_;
  TVar30.id_ = local_808.id_;
  TVar60.length_ = sStack_820;
  TVar60.ptr_ = (char *)peer.dict_;
  TVar60._16_8_ = local_818;
  TVar60.id_ = TStack_810;
  ctemplate::TemplateDictionary::SetEscapedValue(TVar30,TVar60,(TemplateModifier *)local_78);
  ctemplate::TemplateDictionaryPeer::TemplateDictionaryPeer(&local_830,local_78);
  ctemplate::TemplateString::TemplateString(&local_850,"easy snippet");
  pcVar62 = ctemplate::TemplateDictionaryPeer::GetSectionValue(&local_830,&local_850);
  iVar61 = strcmp(pcVar62,"foo");
  if (iVar61 != 0) {
    fprintf(_stderr,"Check failed: %s\n",
            "strcmp(peer.GetSectionValue(\"easy snippet\"), \"foo\") == 0");
    exit(1);
  }
  ctemplate::TemplateString::TemplateString(&local_870,"valid snippet");
  pcVar62 = ctemplate::TemplateDictionaryPeer::GetSectionValue(&local_830,&local_870);
  iVar61 = strcmp(pcVar62,"<b>foo<br> &amp; b<wbr>&shy;ar</b>");
  if (iVar61 != 0) {
    fprintf(_stderr,"Check failed: %s\n",
            "strcmp(peer.GetSectionValue(\"valid snippet\"), \"<b>foo<br> &amp; b<wbr>&shy;ar</b>\") == 0"
           );
    exit(1);
  }
  ctemplate::TemplateString::TemplateString(&local_890,"invalid snippet");
  pcVar62 = ctemplate::TemplateDictionaryPeer::GetSectionValue(&local_830,&local_890);
  iVar61 = strcmp(pcVar62,"<b>&lt;A HREF=&#39;foo&#39; id=&quot;bar  &&amp;{ baz&quot;&gt;</b>");
  if (iVar61 != 0) {
    fprintf(_stderr,"Check failed: %s\n",
            "strcmp(peer.GetSectionValue(\"invalid snippet\"), \"<b>&lt;A HREF=&#39;foo&#39; id=&quot;bar  &&amp;{ \" \"baz&quot;&gt;</b>\") == 0"
           );
    exit(1);
  }
  ctemplate::TemplateString::TemplateString(&local_8b0,"snippet with italics");
  pcVar62 = ctemplate::TemplateDictionaryPeer::GetSectionValue(&local_830,&local_8b0);
  iVar61 = strcmp(pcVar62,"<i>foo<br> &amp; b<wbr>&shy;ar</i>");
  if (iVar61 != 0) {
    fprintf(_stderr,"Check failed: %s\n",
            "strcmp(peer.GetSectionValue(\"snippet with italics\"), \"<i>foo<br> &amp; b<wbr>&shy;ar</i>\") == 0"
           );
    exit(1);
  }
  ctemplate::TemplateString::TemplateString(&local_8d0,"unclosed snippet");
  pcVar62 = ctemplate::TemplateDictionaryPeer::GetSectionValue(&local_830,&local_8d0);
  iVar61 = strcmp(pcVar62,"<b>foo</b>");
  if (iVar61 != 0) {
    fprintf(_stderr,"Check failed: %s\n",
            "strcmp(peer.GetSectionValue(\"unclosed snippet\"), \"<b>foo</b>\") == 0");
    exit(1);
  }
  ctemplate::TemplateString::TemplateString(&local_8f0,"snippet with interleaving");
  pcVar62 = ctemplate::TemplateDictionaryPeer::GetSectionValue(&local_830,&local_8f0);
  iVar61 = strcmp(pcVar62,"<b><i>foo</b></i>");
  if (iVar61 != 0) {
    fprintf(_stderr,"Check failed: %s\n",
            "strcmp(peer.GetSectionValue(\"snippet with interleaving\"), \"<b><i>foo</b></i>\") == 0"
           );
    exit(1);
  }
  ctemplate::TemplateString::TemplateString(&local_910,"unclosed interleaving");
  pcVar62 = ctemplate::TemplateDictionaryPeer::GetSectionValue(&local_830,&local_910);
  iVar61 = strcmp(pcVar62,"<b><i>&lt;b&gt;foo</b></i>");
  if (iVar61 != 0) {
    fprintf(_stderr,"Check failed: %s\n",
            "strcmp(peer.GetSectionValue(\"unclosed interleaving\"), \"<b><i>&lt;b&gt;foo</b></i>\") == 0"
           );
    exit(1);
  }
  ctemplate::TemplateString::TemplateString(&local_930,"unclosed");
  pcVar62 = ctemplate::TemplateDictionaryPeer::GetSectionValue(&local_830,&local_930);
  iVar61 = strcmp(pcVar62,"<b><i>foo</i></b>");
  if (iVar61 != 0) {
    fprintf(_stderr,"Check failed: %s\n",
            "strcmp(peer.GetSectionValue(\"unclosed\"), \"<b><i>foo</i></b>\") == 0");
    exit(1);
  }
  ctemplate::TemplateString::TemplateString(&local_950,"unterminated 1");
  pcVar62 = ctemplate::TemplateDictionaryPeer::GetSectionValue(&local_830,&local_950);
  iVar61 = strcmp(pcVar62,"foo&lt;");
  if (iVar61 != 0) {
    fprintf(_stderr,"Check failed: %s\n",
            "strcmp(peer.GetSectionValue(\"unterminated 1\"), \"foo&lt;\") == 0");
    exit(1);
  }
  ctemplate::TemplateString::TemplateString(&local_970,"unterminated 2");
  pcVar62 = ctemplate::TemplateDictionaryPeer::GetSectionValue(&local_830,&local_970);
  iVar61 = strcmp(pcVar62,"foo&lt;b");
  if (iVar61 != 0) {
    fprintf(_stderr,"Check failed: %s\n",
            "strcmp(peer.GetSectionValue(\"unterminated 2\"), \"foo&lt;b\") == 0");
    exit(1);
  }
  ctemplate::TemplateString::TemplateString(&local_990,"unterminated 3");
  pcVar62 = ctemplate::TemplateDictionaryPeer::GetSectionValue(&local_830,&local_990);
  iVar61 = strcmp(pcVar62,"foo&lt;/");
  if (iVar61 != 0) {
    fprintf(_stderr,"Check failed: %s\n",
            "strcmp(peer.GetSectionValue(\"unterminated 3\"), \"foo&lt;/\") == 0");
    exit(1);
  }
  ctemplate::TemplateString::TemplateString(&local_9b0,"unterminated 4");
  pcVar62 = ctemplate::TemplateDictionaryPeer::GetSectionValue(&local_830,&local_9b0);
  iVar61 = strcmp(pcVar62,"foo&lt;/b");
  if (iVar61 != 0) {
    fprintf(_stderr,"Check failed: %s\n",
            "strcmp(peer.GetSectionValue(\"unterminated 4\"), \"foo&lt;/b\") == 0");
    exit(1);
  }
  ctemplate::TemplateString::TemplateString(&local_9d0,"unterminated 5");
  pcVar62 = ctemplate::TemplateDictionaryPeer::GetSectionValue(&local_830,&local_9d0);
  iVar61 = strcmp(pcVar62,"<b>foo&lt;/b</b>");
  if (iVar61 != 0) {
    fprintf(_stderr,"Check failed: %s\n",
            "strcmp(peer.GetSectionValue(\"unterminated 5\"), \"<b>foo&lt;/b</b>\") == 0");
    exit(1);
  }
  ctemplate::TemplateString::TemplateString(&local_9f0,"close b i");
  pcVar62 = ctemplate::TemplateDictionaryPeer::GetSectionValue(&local_830,&local_9f0);
  iVar61 = strcmp(pcVar62,"<i><b>foo</b></i>");
  if (iVar61 != 0) {
    fprintf(_stderr,"Check failed: %s\n",
            "strcmp(peer.GetSectionValue(\"close b i\"), \"<i><b>foo</b></i>\") == 0");
    exit(1);
  }
  ctemplate::TemplateString::TemplateString(&local_a10,"close i b");
  pcVar62 = ctemplate::TemplateDictionaryPeer::GetSectionValue(&local_830,&local_a10);
  iVar61 = strcmp(pcVar62,"<b><i>foo</i></b>");
  if (iVar61 != 0) {
    fprintf(_stderr,"Check failed: %s\n",
            "strcmp(peer.GetSectionValue(\"close i b\"), \"<b><i>foo</i></b>\") == 0");
    exit(1);
  }
  ctemplate::TemplateString::TemplateString(&local_a30,"em");
  pcVar62 = ctemplate::TemplateDictionaryPeer::GetSectionValue(&local_830,&local_a30);
  iVar61 = strcmp(pcVar62,"<em>foo</em>");
  if (iVar61 == 0) {
    ctemplate::TemplateString::TemplateString(&local_a50,"nested em");
    pcVar62 = ctemplate::TemplateDictionaryPeer::GetSectionValue(&local_830,&local_a50);
    iVar61 = strcmp(pcVar62,"<b>This is foo<em>...</em></b>");
    if (iVar61 != 0) {
      fprintf(_stderr,"Check failed: %s\n",
              "strcmp(peer.GetSectionValue(\"nested em\"), \"<b>This is foo<em>...</em></b>\") == 0"
             );
      exit(1);
    }
    ctemplate::TemplateString::TemplateString(&local_a70,"unclosed em");
    pcVar62 = ctemplate::TemplateDictionaryPeer::GetSectionValue(&local_830,&local_a70);
    iVar61 = strcmp(pcVar62,"<em>foo</em>");
    if (iVar61 != 0) {
      fprintf(_stderr,"Check failed: %s\n",
              "strcmp(peer.GetSectionValue(\"unclosed em\"), \"<em>foo</em>\") == 0");
      exit(1);
    }
    ctemplate::TemplateString::TemplateString(&local_a90,"wrongly closed em");
    pcVar62 = ctemplate::TemplateDictionaryPeer::GetSectionValue(&local_830,&local_a90);
    iVar61 = strcmp(pcVar62,"foo&lt;/em&gt;");
    if (iVar61 != 0) {
      fprintf(_stderr,"Check failed: %s\n",
              "strcmp(peer.GetSectionValue(\"wrongly closed em\"), \"foo&lt;/em&gt;\") == 0");
      exit(1);
    }
    ctemplate::TemplateString::TemplateString(&local_ab0,"misnested em");
    pcVar62 = ctemplate::TemplateDictionaryPeer::GetSectionValue(&local_830,&local_ab0);
    iVar61 = strcmp(pcVar62,"<i><em>foo</i></em>");
    if (iVar61 != 0) {
      fprintf(_stderr,"Check failed: %s\n",
              "strcmp(peer.GetSectionValue(\"misnested em\"), \"<i><em>foo</i></em>\") == 0");
      exit(1);
    }
    ctemplate::TemplateString::TemplateString(&local_ad0,"span ltr");
    pcVar62 = ctemplate::TemplateDictionaryPeer::GetSectionValue(&local_830,&local_ad0);
    iVar61 = strcmp(pcVar62,"<span dir=ltr>bidi text</span>");
    if (iVar61 != 0) {
      fprintf(_stderr,"Check failed: %s\n",
              "strcmp(peer.GetSectionValue(\"span ltr\"), \"<span dir=ltr>bidi text</span>\") == 0")
      ;
      exit(1);
    }
    ctemplate::TemplateString::TemplateString(&local_af0,"span rtl");
    pcVar62 = ctemplate::TemplateDictionaryPeer::GetSectionValue(&local_830,&local_af0);
    iVar61 = strcmp(pcVar62,"<span dir=rtl>bidi text</span>");
    if (iVar61 != 0) {
      fprintf(_stderr,"Check failed: %s\n",
              "strcmp(peer.GetSectionValue(\"span rtl\"), \"<span dir=rtl>bidi text</span>\") == 0")
      ;
      exit(1);
    }
    ctemplate::TemplateString::TemplateString(&local_b10,"span garbage dir attr");
    pcVar62 = ctemplate::TemplateDictionaryPeer::GetSectionValue(&local_830,&local_b10);
    iVar61 = strcmp(pcVar62,"&lt;span dir=foo&gt;bidi text&lt;/span&gt;");
    if (iVar61 != 0) {
      fprintf(_stderr,"Check failed: %s\n",
              "strcmp(peer.GetSectionValue(\"span garbage dir attr\"), \"&lt;span dir=foo&gt;bidi text&lt;/span&gt;\") == 0"
             );
      exit(1);
    }
    ctemplate::TemplateString::TemplateString(&local_b30,"span no dir");
    pcVar62 = ctemplate::TemplateDictionaryPeer::GetSectionValue(&local_830,&local_b30);
    iVar61 = strcmp(pcVar62,"&lt;span&gt;bidi text&lt;/span&gt;");
    if (iVar61 == 0) {
      ctemplate::TemplateString::TemplateString(&local_b50,"span bad attribute");
      pcVar62 = ctemplate::TemplateDictionaryPeer::GetSectionValue(&local_830,&local_b50);
      iVar61 = strcmp(pcVar62,"&lt;span onclick=alert(&#39;foo&#39;)&gt;bidi text&lt;/span&gt;");
      if (iVar61 != 0) {
        fprintf(_stderr,"Check failed: %s\n",
                "strcmp(peer.GetSectionValue(\"span bad attribute\"), \"&lt;span onclick=alert(&#39;foo&#39;)&gt;bidi text&lt;/span&gt;\") == 0"
               );
        exit(1);
      }
      ctemplate::TemplateString::TemplateString(&local_b70,"span quotes");
      pcVar62 = ctemplate::TemplateDictionaryPeer::GetSectionValue(&local_830,&local_b70);
      iVar61 = strcmp(pcVar62,"&lt;span dir=&quot;rtl&quot;&gt;bidi text&lt;/span&gt;");
      if (iVar61 != 0) {
        fprintf(_stderr,"Check failed: %s\n",
                "strcmp(peer.GetSectionValue(\"span quotes\"), \"&lt;span dir=&quot;rtl&quot;&gt;bidi text&lt;/span&gt;\") == 0"
               );
        exit(1);
      }
      ctemplate::TemplateString::TemplateString(&local_b90,"nested span");
      pcVar62 = ctemplate::TemplateDictionaryPeer::GetSectionValue(&local_830,&local_b90);
      iVar61 = strcmp(pcVar62,"<b>This is <span dir=rtl>bidi text</span></b>");
      if (iVar61 != 0) {
        fprintf(_stderr,"Check failed: %s\n",
                "strcmp(peer.GetSectionValue(\"nested span\"), \"<b>This is <span dir=rtl>bidi text</span></b>\") == 0"
               );
        exit(1);
      }
      ctemplate::TemplateString::TemplateString(&local_bb0,"doubly-nested span");
      pcVar62 = ctemplate::TemplateDictionaryPeer::GetSectionValue(&local_830,&local_bb0);
      iVar61 = strcmp(pcVar62,
                      "<span dir=rtl>This is &lt;span dir=rtl&gt;bidi text</span>&lt;/span&gt;");
      if (iVar61 == 0) {
        ctemplate::TemplateString::TemplateString(&local_bd0,"two spans");
        pcVar62 = ctemplate::TemplateDictionaryPeer::GetSectionValue(&local_830,&local_bd0);
        iVar61 = strcmp(pcVar62,
                        "<b>This is <span dir=rtl>text</span> that is <span dir=rtl>bidi.</span></b>"
                       );
        if (iVar61 != 0) {
          fprintf(_stderr,"Check failed: %s\n",
                  "strcmp(peer.GetSectionValue(\"two spans\"), \"<b>This is <span dir=rtl>text</span> that is \" \"<span dir=rtl>bidi.</span></b>\") == 0"
                 );
          exit(1);
        }
        ctemplate::TemplateString::TemplateString(&local_bf0,"unclosed span");
        pcVar62 = ctemplate::TemplateDictionaryPeer::GetSectionValue(&local_830,&local_bf0);
        iVar61 = strcmp(pcVar62,"<b>This is <span dir=rtl>bidi text</span></b>");
        if (iVar61 == 0) {
          ctemplate::TemplateDictionary::~TemplateDictionary(local_78);
          return;
        }
        fprintf(_stderr,"Check failed: %s\n",
                "strcmp(peer.GetSectionValue(\"unclosed span\"), \"<b>This is <span dir=rtl>bidi text</span></b>\") == 0"
               );
        exit(1);
      }
      fprintf(_stderr,"Check failed: %s\n",
              "strcmp(peer.GetSectionValue(\"doubly-nested span\"), \"<span dir=rtl>This is &lt;span dir=rtl&gt;bidi text\" \"</span>&lt;/span&gt;\") == 0"
             );
      exit(1);
    }
    fprintf(_stderr,"Check failed: %s\n",
            "strcmp(peer.GetSectionValue(\"span no dir\"), \"&lt;span&gt;bidi text&lt;/span&gt;\") == 0"
           );
    exit(1);
  }
  fprintf(_stderr,"Check failed: %s\n","strcmp(peer.GetSectionValue(\"em\"), \"<em>foo</em>\") == 0"
         );
  exit(1);
}

Assistant:

TEST(TemplateModifiers, SnippetEscape) {
  GOOGLE_NAMESPACE::TemplateDictionary dict("TestSnippetEscape", NULL);
  dict.SetEscapedValue("easy snippet", "foo",
                       GOOGLE_NAMESPACE::snippet_escape);
  dict.SetEscapedValue("valid snippet",
                       "<b>foo<br> &amp; b<wbr>&shy;ar</b>",
                       GOOGLE_NAMESPACE::snippet_escape);
  dict.SetEscapedValue("invalid snippet",
                       "<b><A HREF='foo'\nid=\"bar\t\t&&{\vbaz\">",
                       GOOGLE_NAMESPACE::snippet_escape);
  dict.SetEscapedValue("snippet with italics",
                       "<i>foo<br> &amp; b<wbr>&shy;ar</i>",
                       GOOGLE_NAMESPACE::snippet_escape);
  dict.SetEscapedValue("unclosed snippet",
                       "<b>foo",
                       GOOGLE_NAMESPACE::snippet_escape);
  dict.SetEscapedValue("snippet with interleaving",
                       "<b><i>foo</b></i>",
                       GOOGLE_NAMESPACE::snippet_escape);
  dict.SetEscapedValue("unclosed interleaving",
                       "<b><i><b>foo</b>",
                       GOOGLE_NAMESPACE::snippet_escape);
  dict.SetEscapedValue("unclosed",
                       "<b><i>foo",
                       GOOGLE_NAMESPACE::snippet_escape);
  dict.SetEscapedValue("unterminated 1",
                       "foo<",
                       GOOGLE_NAMESPACE::snippet_escape);
  dict.SetEscapedValue("unterminated 2",
                       "foo<b",
                       GOOGLE_NAMESPACE::snippet_escape);
  dict.SetEscapedValue("unterminated 3",
                       "foo</",
                       GOOGLE_NAMESPACE::snippet_escape);
  dict.SetEscapedValue("unterminated 4",
                       "foo</b",
                       GOOGLE_NAMESPACE::snippet_escape);
  dict.SetEscapedValue("unterminated 5",
                       "<b>foo</b",
                       GOOGLE_NAMESPACE::snippet_escape);
  dict.SetEscapedValue("close b i",
                       "<i><b>foo",
                       GOOGLE_NAMESPACE::snippet_escape);
  dict.SetEscapedValue("close i b",
                       "<b><i>foo",
                       GOOGLE_NAMESPACE::snippet_escape);
  dict.SetEscapedValue("em",
                       "<em>foo</em>",
                       GOOGLE_NAMESPACE::snippet_escape);
  dict.SetEscapedValue("nested em",
                       "<b>This is foo<em>...</em></b>",
                       GOOGLE_NAMESPACE::snippet_escape);
  dict.SetEscapedValue("unclosed em",
                       "<em>foo",
                       GOOGLE_NAMESPACE::snippet_escape);
  dict.SetEscapedValue("wrongly closed em",
                       "foo</em>",
                       GOOGLE_NAMESPACE::snippet_escape);
  dict.SetEscapedValue("misnested em",
                       "<i><em>foo</i></em>",
                       GOOGLE_NAMESPACE::snippet_escape);
  dict.SetEscapedValue("span ltr",
                       "<span dir=ltr>bidi text</span>",
                       GOOGLE_NAMESPACE::snippet_escape);
  dict.SetEscapedValue("span rtl",
                       "<span dir=rtl>bidi text</span>",
                       GOOGLE_NAMESPACE::snippet_escape);
  dict.SetEscapedValue("span garbage dir attr",
                       "<span dir=foo>bidi text</span>",
                       GOOGLE_NAMESPACE::snippet_escape);
  dict.SetEscapedValue("span no dir",
                       "<span>bidi text</span>",
                       GOOGLE_NAMESPACE::snippet_escape);
  dict.SetEscapedValue("span bad attribute",
                       "<span onclick=alert('foo')>bidi text</span>",
                       GOOGLE_NAMESPACE::snippet_escape);
  dict.SetEscapedValue("span quotes",
                       "<span dir=\"rtl\">bidi text</span>",
                       GOOGLE_NAMESPACE::snippet_escape);
  dict.SetEscapedValue("nested span",
                       "<b>This is <span dir=rtl>bidi text</span></b>",
                       GOOGLE_NAMESPACE::snippet_escape);
  dict.SetEscapedValue("doubly-nested span",
                       "<span dir=rtl>This is <span dir=rtl>"
                       "bidi text</span></span>",
                       GOOGLE_NAMESPACE::snippet_escape);
  dict.SetEscapedValue("two spans",
                       "<b>This is <span dir=rtl>text</span> that is "
                       "<span dir=rtl>bidi.</span></b>",
                       GOOGLE_NAMESPACE::snippet_escape);
  dict.SetEscapedValue("unclosed span",
                       "<b>This is <span dir=rtl>bidi text",
                       GOOGLE_NAMESPACE::snippet_escape);


  GOOGLE_NAMESPACE::TemplateDictionaryPeer peer(&dict);  // peer can look inside dicts
  EXPECT_STREQ(peer.GetSectionValue("easy snippet"), "foo");
  EXPECT_STREQ(peer.GetSectionValue("valid snippet"),
               "<b>foo<br> &amp; b<wbr>&shy;ar</b>");
  EXPECT_STREQ(peer.GetSectionValue("invalid snippet"),
               "<b>&lt;A HREF=&#39;foo&#39; id=&quot;bar  &&amp;{ "
               "baz&quot;&gt;</b>");
  EXPECT_STREQ(peer.GetSectionValue("snippet with italics"),
               "<i>foo<br> &amp; b<wbr>&shy;ar</i>");
  EXPECT_STREQ(peer.GetSectionValue("unclosed snippet"),
               "<b>foo</b>");
  EXPECT_STREQ(peer.GetSectionValue("snippet with interleaving"),
               "<b><i>foo</b></i>");
  EXPECT_STREQ(peer.GetSectionValue("unclosed interleaving"),
               "<b><i>&lt;b&gt;foo</b></i>");
  EXPECT_STREQ(peer.GetSectionValue("unclosed"),
               "<b><i>foo</i></b>");
  EXPECT_STREQ(peer.GetSectionValue("unterminated 1"), "foo&lt;");
  EXPECT_STREQ(peer.GetSectionValue("unterminated 2"), "foo&lt;b");
  EXPECT_STREQ(peer.GetSectionValue("unterminated 3"), "foo&lt;/");
  EXPECT_STREQ(peer.GetSectionValue("unterminated 4"), "foo&lt;/b");
  EXPECT_STREQ(peer.GetSectionValue("unterminated 5"), "<b>foo&lt;/b</b>");
  EXPECT_STREQ(peer.GetSectionValue("close b i"), "<i><b>foo</b></i>");
  EXPECT_STREQ(peer.GetSectionValue("close i b"), "<b><i>foo</i></b>");
  EXPECT_STREQ(peer.GetSectionValue("em"), "<em>foo</em>");
  EXPECT_STREQ(peer.GetSectionValue("nested em"),
               "<b>This is foo<em>...</em></b>");
  EXPECT_STREQ(peer.GetSectionValue("unclosed em"), "<em>foo</em>");
  EXPECT_STREQ(peer.GetSectionValue("wrongly closed em"), "foo&lt;/em&gt;");
  EXPECT_STREQ(peer.GetSectionValue("misnested em"), "<i><em>foo</i></em>");
  EXPECT_STREQ(peer.GetSectionValue("span ltr"),
               "<span dir=ltr>bidi text</span>");
  EXPECT_STREQ(peer.GetSectionValue("span rtl"),
               "<span dir=rtl>bidi text</span>");
  EXPECT_STREQ(peer.GetSectionValue("span garbage dir attr"),
               "&lt;span dir=foo&gt;bidi text&lt;/span&gt;");
  EXPECT_STREQ(peer.GetSectionValue("span no dir"),
               "&lt;span&gt;bidi text&lt;/span&gt;");
  EXPECT_STREQ(peer.GetSectionValue("span bad attribute"),
               "&lt;span onclick=alert(&#39;foo&#39;)&gt;bidi text&lt;/span&gt;");
  EXPECT_STREQ(peer.GetSectionValue("span quotes"),
               "&lt;span dir=&quot;rtl&quot;&gt;bidi text&lt;/span&gt;");
  EXPECT_STREQ(peer.GetSectionValue("nested span"),
               "<b>This is <span dir=rtl>bidi text</span></b>");
  EXPECT_STREQ(peer.GetSectionValue("doubly-nested span"),
               "<span dir=rtl>This is &lt;span dir=rtl&gt;bidi text"
               "</span>&lt;/span&gt;");
  EXPECT_STREQ(peer.GetSectionValue("two spans"),
               "<b>This is <span dir=rtl>text</span> that is "
               "<span dir=rtl>bidi.</span></b>");
  EXPECT_STREQ(peer.GetSectionValue("unclosed span"),
               "<b>This is <span dir=rtl>bidi text</span></b>");
}